

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void BlendPlaneRow_C(uint8_t *src0,uint8_t *src1,uint8_t *alpha,uint8_t *dst,int width)

{
  long lVar1;
  
  if (1 < width) {
    lVar1 = 0;
    do {
      dst[lVar1] = (uint8_t)((uint)src0[lVar1] * (uint)alpha[lVar1] + 0xff +
                             (uint)src1[lVar1] * (alpha[lVar1] ^ 0xff) >> 8);
      dst[lVar1 + 1] =
           (uint8_t)((uint)src0[lVar1 + 1] * (uint)alpha[lVar1 + 1] + 0xff +
                     (uint)src1[lVar1 + 1] * (alpha[lVar1 + 1] ^ 0xff) >> 8);
      lVar1 = lVar1 + 2;
    } while ((int)lVar1 < width + -1);
    src0 = src0 + lVar1;
    dst = dst + lVar1;
    alpha = alpha + lVar1;
    src1 = src1 + lVar1;
  }
  if ((width & 1U) != 0) {
    *dst = (uint8_t)((uint)*src0 * (uint)*alpha + 0xff + (uint)*src1 * (*alpha ^ 0xff) >> 8);
  }
  return;
}

Assistant:

void BlendPlaneRow_C(const uint8_t* src0,
                     const uint8_t* src1,
                     const uint8_t* alpha,
                     uint8_t* dst,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst[0] = UBLEND(src0[0], src1[0], alpha[0]);
    dst[1] = UBLEND(src0[1], src1[1], alpha[1]);
    src0 += 2;
    src1 += 2;
    alpha += 2;
    dst += 2;
  }
  if (width & 1) {
    dst[0] = UBLEND(src0[0], src1[0], alpha[0]);
  }
}